

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O2

void __thiscall inject::no_component::no_component(no_component *this,unique_id id)

{
  ostream *poVar1;
  stringstream oss;
  string asStack_1b8 [32];
  stringstream local_198 [16];
  ostream local_188 [376];
  
  *(undefined ***)this = &PTR__no_component_00114830;
  this->_id = id;
  (this->_name)._M_dataplus._M_p = (pointer)&(this->_name).field_2;
  (this->_name)._M_string_length = 0;
  (this->_name).field_2._M_local_buf[0] = '\0';
  (this->_msg)._M_dataplus._M_p = (pointer)&(this->_msg).field_2;
  (this->_msg)._M_string_length = 0;
  (this->_msg).field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = std::operator<<(local_188,"no such component ");
  std::ostream::_M_insert<long>((long)poVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->_msg,asStack_1b8);
  std::__cxx11::string::~string(asStack_1b8);
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

no_component(unique_id id) throw() : exception(), _id(id) {
        std::stringstream oss;
        oss << "no such component " << id;
        _msg = oss.str();
    }